

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O0

bool __thiscall
cmIfFunctionBlocker::Replay
          (cmIfFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> lff;
  bool bVar1;
  cmMakefile *this_00;
  string *psVar2;
  cmListFileContext *pcVar3;
  long lVar4;
  cmake *pcVar5;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_408;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  undefined1 local_3c8 [8];
  cmExecutionStatus status;
  string local_350;
  cmAlphaNum local_330;
  undefined1 local_300 [8];
  string err;
  undefined1 local_2d8 [7];
  bool isTrue;
  undefined1 local_2c8 [8];
  cmConditionEvaluator conditionEvaluator;
  undefined1 local_290 [4];
  MessageType messType;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  string local_250;
  string local_230;
  string local_210;
  cmListFileContext local_1f0;
  undefined1 local_180 [24];
  cmListFileBacktrace elseifBT;
  string local_158;
  string local_138;
  string local_108;
  cmListFileContext local_e8;
  undefined1 local_78 [24];
  cmListFileBacktrace elseBT;
  cmListFileFunction *func;
  iterator __end1;
  iterator __begin1;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range1;
  int scopeDepth;
  cmMakefile *mf;
  cmExecutionStatus *inStatus_local;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions_local;
  cmIfFunctionBlocker *this_local;
  
  this_00 = cmExecutionStatus::GetMakefile(inStatus);
  __range1._4_4_ = 0;
  __end1 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin(functions);
  func = (cmListFileFunction *)
         std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end(functions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                     *)&func), bVar1) {
    elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
         ::operator*(&__end1);
    psVar2 = cmListFileFunction::LowerCaseName_abi_cxx11_
                       ((cmListFileFunction *)
                        elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi);
    bVar1 = std::operator==(psVar2,"if");
    if (bVar1) {
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    psVar2 = cmListFileFunction::LowerCaseName_abi_cxx11_
                       ((cmListFileFunction *)
                        elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi);
    bVar1 = std::operator==(psVar2,"endif");
    if (bVar1) {
      __range1._4_4_ = __range1._4_4_ + -1;
    }
    if (__range1._4_4_ == 0) {
      psVar2 = cmListFileFunction::LowerCaseName_abi_cxx11_
                         ((cmListFileFunction *)
                          elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                          .
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi);
      bVar1 = std::operator==(psVar2,"else");
      if (!bVar1) goto LAB_002de34d;
      cmMakefile::GetBacktrace((cmMakefile *)local_78);
      psVar2 = cmListFileFunction::OriginalName_abi_cxx11_
                         ((cmListFileFunction *)
                          elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                          .
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi);
      std::__cxx11::string::string((string *)&local_108,(string *)psVar2);
      pcVar3 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
      std::__cxx11::string::string((string *)&local_138,(string *)&pcVar3->FilePath);
      lVar4 = cmListFileFunction::Line
                        ((cmListFileFunction *)
                         elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
      cmListFileContext::cmListFileContext(&local_e8,&local_108,&local_138,lVar4);
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_78 + 0x10),
                 (cmListFileContext *)local_78);
      cmListFileContext::~cmListFileContext(&local_e8);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_108);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_78);
      if ((this->ElseSeen & 1U) == 0) {
        this->IsBlocking = (bool)(this->HasRun & 1);
        this->HasRun = true;
        this->ElseSeen = true;
        if ((this->IsBlocking & 1U) == 0) {
          pcVar5 = cmMakefile::GetCMakeInstance(this_00);
          bVar1 = cmake::GetTrace(pcVar5);
          if (bVar1) {
            cmMakefile::PrintCommandTrace
                      (this_00,(cmListFileFunction *)
                               elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                               TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi,(cmListFileBacktrace *)(local_78 + 0x10),Yes);
          }
        }
        elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._0_4_ = 0;
      }
      else {
        pcVar5 = cmMakefile::GetCMakeInstance(this_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"A duplicate ELSE command was found inside an IF block.",
                   (allocator<char> *)
                   ((long)&elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                           TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + 7));
        cmake::IssueMessage(pcVar5,FATAL_ERROR,&local_158,(cmListFileBacktrace *)(local_78 + 0x10));
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                           TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + 7));
        cmSystemTools::SetFatalErrorOccurred();
        this_local._7_1_ = 1;
        elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._0_4_ = 1;
      }
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_78 + 0x10));
joined_r0x002de936:
      if ((uint)elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != 0) goto LAB_002deb83;
    }
    else {
LAB_002de34d:
      if (__range1._4_4_ == 0) {
        psVar2 = cmListFileFunction::LowerCaseName_abi_cxx11_
                           ((cmListFileFunction *)
                            elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                            TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        bVar1 = std::operator==(psVar2,"elseif");
        if (bVar1) {
          cmMakefile::GetBacktrace((cmMakefile *)local_180);
          psVar2 = cmListFileFunction::OriginalName_abi_cxx11_
                             ((cmListFileFunction *)
                              elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                              TopEntry.
                              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
          std::__cxx11::string::string((string *)&local_210,(string *)psVar2);
          pcVar3 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
          std::__cxx11::string::string((string *)&local_230,(string *)&pcVar3->FilePath);
          lVar4 = cmListFileFunction::Line
                            ((cmListFileFunction *)
                             elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                             TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
          cmListFileContext::cmListFileContext(&local_1f0,&local_210,&local_230,lVar4);
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_180 + 0x10),
                     (cmListFileContext *)local_180);
          cmListFileContext::~cmListFileContext(&local_1f0);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&local_210);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_180);
          if ((this->ElseSeen & 1U) == 0) {
            if ((this->HasRun & 1U) == 0) {
              pcVar5 = cmMakefile::GetCMakeInstance(this_00);
              bVar1 = cmake::GetTrace(pcVar5);
              if (bVar1) {
                cmMakefile::PrintCommandTrace
                          (this_00,(cmListFileFunction *)
                                   elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                   .TopEntry.
                                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi,(cmListFileBacktrace *)(local_180 + 0x10),Yes)
                ;
              }
              std::__cxx11::string::string
                        ((string *)
                         &expandedArguments.
                          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
              vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)local_290);
              inArgs = cmListFileFunction::Arguments
                                 ((cmListFileFunction *)
                                  elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                  TopEntry.
                                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi);
              cmMakefile::ExpandArguments
                        (this_00,inArgs,
                         (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                          *)local_290);
              cmListFileBacktrace::cmListFileBacktrace
                        ((cmListFileBacktrace *)local_2d8,(cmListFileBacktrace *)(local_180 + 0x10))
              ;
              cmConditionEvaluator::cmConditionEvaluator
                        ((cmConditionEvaluator *)local_2c8,this_00,(cmListFileBacktrace *)local_2d8)
              ;
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_2d8);
              err.field_2._M_local_buf[0xf] =
                   cmConditionEvaluator::IsTrue
                             ((cmConditionEvaluator *)local_2c8,
                              (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                               *)local_290,
                              (string *)
                              &expandedArguments.
                               super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (MessageType *)&conditionEvaluator.field_0x2c);
              uVar6 = std::__cxx11::string::empty();
              if ((uVar6 & 1) == 0) {
                cmIfCommandError_abi_cxx11_
                          (&local_350,
                           (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            *)local_290);
                cmAlphaNum::cmAlphaNum(&local_330,&local_350);
                cmAlphaNum::cmAlphaNum
                          ((cmAlphaNum *)
                           &status.Variables.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (string *)
                           &expandedArguments.
                            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                cmStrCat<>((string *)local_300,&local_330,
                           (cmAlphaNum *)
                           &status.Variables.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::__cxx11::string::~string((string *)&local_350);
                pcVar5 = cmMakefile::GetCMakeInstance(this_00);
                cmake::IssueMessage(pcVar5,conditionEvaluator._44_4_,(string *)local_300,
                                    (cmListFileBacktrace *)(local_180 + 0x10));
                bVar1 = conditionEvaluator._44_4_ == 2;
                if (bVar1) {
                  cmSystemTools::SetFatalErrorOccurred();
                  this_local._7_1_ = 1;
                }
                elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi._1_3_ = 0;
                elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi._0_1_ = bVar1;
                std::__cxx11::string::~string((string *)local_300);
                if ((uint)elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                          TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi == 0) goto LAB_002de898;
              }
              else {
LAB_002de898:
                if ((err.field_2._M_local_buf[0xf] & 1U) != 0) {
                  this->IsBlocking = false;
                  this->HasRun = true;
                }
                elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi._0_4_ = 0;
              }
              cmConditionEvaluator::~cmConditionEvaluator((cmConditionEvaluator *)local_2c8);
              std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
              ~vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                       *)local_290);
              std::__cxx11::string::~string
                        ((string *)
                         &expandedArguments.
                          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if ((uint)elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                        .
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != 0) goto LAB_002de922;
            }
            else {
              this->IsBlocking = true;
            }
            elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._0_4_ = 0;
          }
          else {
            pcVar5 = cmMakefile::GetCMakeInstance(this_00);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_250,"An ELSEIF command was found after an ELSE command.",
                       (allocator<char> *)(errorString.field_2._M_local_buf + 0xf));
            cmake::IssueMessage(pcVar5,FATAL_ERROR,&local_250,
                                (cmListFileBacktrace *)(local_180 + 0x10));
            std::__cxx11::string::~string((string *)&local_250);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(errorString.field_2._M_local_buf + 0xf));
            cmSystemTools::SetFatalErrorOccurred();
            this_local._7_1_ = 1;
            elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._0_4_ = 1;
          }
LAB_002de922:
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_180 + 0x10));
          goto joined_r0x002de936;
        }
      }
      if ((this->IsBlocking & 1U) == 0) {
        cmExecutionStatus::cmExecutionStatus((cmExecutionStatus *)local_3c8,this_00);
        lff = elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional(&local_3f0);
        cmMakefile::ExecuteCommand
                  (this_00,(cmListFileFunction *)lff._M_pi,(cmExecutionStatus *)local_3c8,&local_3f0
                  );
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional(&local_3f0);
        bVar1 = cmExecutionStatus::GetReturnInvoked((cmExecutionStatus *)local_3c8);
        if (bVar1) {
          __x = cmExecutionStatus::GetReturnVariables_abi_cxx11_((cmExecutionStatus *)local_3c8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_408,__x);
          cmExecutionStatus::SetReturnInvoked(inStatus,&local_408);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_408);
          this_local._7_1_ = 1;
          elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._0_4_ = 1;
        }
        else {
          bVar1 = cmExecutionStatus::GetBreakInvoked((cmExecutionStatus *)local_3c8);
          if (bVar1) {
            cmExecutionStatus::SetBreakInvoked(inStatus);
            this_local._7_1_ = 1;
            elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._0_4_ = 1;
          }
          else {
            bVar1 = cmExecutionStatus::GetContinueInvoked((cmExecutionStatus *)local_3c8);
            if (bVar1) {
              cmExecutionStatus::SetContinueInvoked(inStatus);
              this_local._7_1_ = 1;
              elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi._0_4_ = 1;
            }
            else {
              elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi._0_4_ = 0;
            }
          }
        }
        cmExecutionStatus::~cmExecutionStatus((cmExecutionStatus *)local_3c8);
        goto joined_r0x002de936;
      }
    }
    __gnu_cxx::
    __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 1;
LAB_002deb83:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmIfFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                 cmExecutionStatus& inStatus)
{
  cmMakefile& mf = inStatus.GetMakefile();
  // execute the functions for the true parts of the if statement
  int scopeDepth = 0;
  for (cmListFileFunction const& func : functions) {
    // keep track of scope depth
    if (func.LowerCaseName() == "if") {
      scopeDepth++;
    }
    if (func.LowerCaseName() == "endif") {
      scopeDepth--;
    }
    // watch for our state change
    if (scopeDepth == 0 && func.LowerCaseName() == "else") {
      cmListFileBacktrace elseBT = mf.GetBacktrace().Push(
        cmListFileContext{ func.OriginalName(),
                           this->GetStartingContext().FilePath, func.Line() });

      if (this->ElseSeen) {
        mf.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          "A duplicate ELSE command was found inside an IF block.", elseBT);
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }

      this->IsBlocking = this->HasRun;
      this->HasRun = true;
      this->ElseSeen = true;

      // if trace is enabled, print a (trivially) evaluated "else"
      // statement
      if (!this->IsBlocking && mf.GetCMakeInstance()->GetTrace()) {
        mf.PrintCommandTrace(func, elseBT,
                             cmMakefile::CommandMissingFromStack::Yes);
      }
    } else if (scopeDepth == 0 && func.LowerCaseName() == "elseif") {
      cmListFileBacktrace elseifBT = mf.GetBacktrace().Push(
        cmListFileContext{ func.OriginalName(),
                           this->GetStartingContext().FilePath, func.Line() });
      if (this->ElseSeen) {
        mf.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          "An ELSEIF command was found after an ELSE command.", elseifBT);
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }

      if (this->HasRun) {
        this->IsBlocking = true;
      } else {
        // if trace is enabled, print the evaluated "elseif" statement
        if (mf.GetCMakeInstance()->GetTrace()) {
          mf.PrintCommandTrace(func, elseifBT,
                               cmMakefile::CommandMissingFromStack::Yes);
        }

        std::string errorString;

        std::vector<cmExpandedCommandArgument> expandedArguments;
        mf.ExpandArguments(func.Arguments(), expandedArguments);

        MessageType messType;

        cmConditionEvaluator conditionEvaluator(mf, elseifBT);

        bool isTrue =
          conditionEvaluator.IsTrue(expandedArguments, errorString, messType);

        if (!errorString.empty()) {
          std::string err =
            cmStrCat(cmIfCommandError(expandedArguments), errorString);
          mf.GetCMakeInstance()->IssueMessage(messType, err, elseifBT);
          if (messType == MessageType::FATAL_ERROR) {
            cmSystemTools::SetFatalErrorOccurred();
            return true;
          }
        }

        if (isTrue) {
          this->IsBlocking = false;
          this->HasRun = true;
        }
      }
    }

    // should we execute?
    else if (!this->IsBlocking) {
      cmExecutionStatus status(mf);
      mf.ExecuteCommand(func, status);
      if (status.GetReturnInvoked()) {
        inStatus.SetReturnInvoked(status.GetReturnVariables());
        return true;
      }
      if (status.GetBreakInvoked()) {
        inStatus.SetBreakInvoked();
        return true;
      }
      if (status.GetContinueInvoked()) {
        inStatus.SetContinueInvoked();
        return true;
      }
    }
  }
  return true;
}